

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void __thiscall ACSStringPool::LockString(ACSStringPool *this,int strnum)

{
  uint *puVar1;
  
  if ((strnum & 0xfff00000U) != 0x7ff00000) {
    __assert_fail("(strnum & LIBRARYID_MASK) == STRPOOL_LIBRARYID_OR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_acs.cpp"
                  ,0x1ae,"void ACSStringPool::LockString(int)");
  }
  if ((strnum & 0xfffffU) < (this->Pool).Count) {
    puVar1 = &(this->Pool).Array[strnum & 0xfffffU].LockCount;
    *puVar1 = *puVar1 + 1;
    return;
  }
  __assert_fail("(unsigned)strnum < Pool.Size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_acs.cpp"
                ,0x1b0,"void ACSStringPool::LockString(int)");
}

Assistant:

void ACSStringPool::LockString(int strnum)
{
	assert((strnum & LIBRARYID_MASK) == STRPOOL_LIBRARYID_OR);
	strnum &= ~LIBRARYID_MASK;
	assert((unsigned)strnum < Pool.Size());
	Pool[strnum].LockCount++;
}